

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  float *pfVar8;
  int *piVar9;
  Allocator *pAVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  Mat *pMVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  Mat *pMVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  int k_1;
  size_t sVar35;
  undefined1 (*pauVar36) [16];
  int kk;
  ulong uVar37;
  char *pcVar38;
  void *pvVar39;
  void *pvVar40;
  int i;
  long lVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  int iVar44;
  ulong uVar45;
  undefined8 *puVar46;
  int k;
  undefined1 auVar53 [16];
  uint uVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  __m128i _vindex_1;
  undefined1 auVar90 [32];
  float fVar91;
  __m128i _vindex_2;
  undefined1 auVar92 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar101 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar102 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar103 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar108 [32];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  int TILE_M;
  int TILE_K;
  __m256i _vindex;
  int TILE_N;
  undefined8 *local_260;
  ulong local_250;
  ulong local_248;
  long local_230;
  long local_220;
  uint local_204;
  ulong local_200;
  long local_1f8;
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  ulong local_1d8;
  uint local_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [28];
  short asStack_19c [2];
  Mat local_198;
  ulong local_148;
  long local_140;
  Mat *local_138;
  undefined8 local_130;
  long local_128;
  int local_11c;
  Mat local_118;
  Option *local_d0;
  long local_c8;
  ulong local_c0;
  undefined8 local_b8;
  long local_b0;
  ulong local_a8;
  uint local_9c;
  undefined1 local_98 [64];
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  uVar32._0_4_ = (this->super_Convolution).kernel_w;
  uVar32._4_4_ = (this->super_Convolution).kernel_h;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar32;
  auVar52 = vpshufd_avx(auVar51,0x55);
  auVar52 = vpmulld_avx(auVar52,auVar51);
  uVar47 = auVar52._0_4_;
  uVar30 = (this->super_Convolution).num_output;
  uVar45 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar47;
  uVar21 = (ulong)(int)uVar30;
  uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
           (long)(int)uVar30;
  uVar12 = (uint)uVar45;
  uVar50 = uVar45 & 0xffffffff;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar11 = false;
  }
  else {
    bVar11 = 8 < (int)uVar30 || 8 < (int)uVar12;
  }
  auVar53._0_4_ = (this->super_Convolution).dilation_w;
  auVar53._4_4_ = (this->super_Convolution).dilation_h;
  auVar53._8_4_ = (this->super_Convolution).stride_w;
  auVar53._12_4_ = (this->super_Convolution).stride_h;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar32;
  auVar51 = vpunpcklqdq_avx(auVar54,auVar53);
  local_138 = &(this->super_Convolution).weight_data;
  local_d0 = opt;
  if ((((auVar51 == _DAT_005a8b40) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar11)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8
                (uVar30,0,uVar12,(int *)&local_204,&local_11c,(int *)&local_1cc,opt->num_threads);
      uVar32 = (long)(int)((uVar30 - 1) + local_204) / (long)(int)local_204;
      uVar45 = (ulong)(int)local_1cc;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      Mat::create(&local_118,local_1cc * local_204 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      iVar13 = (int)uVar32;
      Mat::create(&this->weight_winograd43_data,local_1cc * local_204,0x24,
                  (int)(uVar12 + local_1cc + -1) / (int)local_1cc,iVar13,4,(Allocator *)0x0);
      if (0 < iVar13) {
        local_250 = 0;
        local_1d8 = uVar45;
        do {
          iVar13 = get_omp_thread_num();
          if (0 < (int)uVar12) {
            iVar29 = (int)local_250 * local_204;
            pMVar20 = (Mat *)((long)iVar13 * local_118.cstep * local_118.elemsize +
                             (long)local_118.data);
            uVar47 = uVar30 - iVar29;
            if ((int)local_204 < (int)uVar47) {
              uVar47 = local_204;
            }
            uVar50 = 0;
            uVar21 = uVar45;
            do {
              uVar45 = local_1d8;
              uVar14 = uVar12 - (int)uVar50;
              if ((int)(uint)uVar21 < (int)uVar14) {
                uVar14 = (uint)uVar21;
              }
              local_1b8._0_4_ = uVar14;
              if (0 < (int)uVar47) {
                pvVar39 = local_138->data;
                uVar21 = 0;
                pMVar31 = pMVar20;
                do {
                  if (0 < (int)uVar14) {
                    uVar37 = 0;
                    do {
                      pcVar38 = (char *)((long)pvVar39 +
                                        (uVar37 + uVar50) * 9 +
                                        (long)(int)((iVar29 + (int)uVar21) * uVar12 * 9));
                      lVar41 = 0;
                      do {
                        cVar2 = *pcVar38;
                        cVar3 = pcVar38[1];
                        cVar4 = pcVar38[2];
                        *(short *)((long)&local_198.data + lVar41 * 2) = cVar2 * 6;
                        *(short *)((long)&local_198.data + lVar41 * 2 + 6) =
                             -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                        *(short *)((long)&local_198.refcount + lVar41 * 2 + 4) =
                             cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                        *(short *)((long)&local_198.elemsize + lVar41 * 2 + 2) =
                             (short)cVar2 + cVar3 * 2 + cVar4 * 4;
                        *(short *)((long)&local_198.elempack + lVar41 * 2) =
                             ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                        *(short *)(&local_198.field_0x1e + lVar41 * 2) = cVar4 * 6;
                        pcVar38 = pcVar38 + 3;
                        lVar41 = lVar41 + 1;
                      } while (lVar41 != 3);
                      lVar41 = 4;
                      do {
                        sVar5 = *(short *)((long)asStack_19c + lVar41);
                        sVar6 = *(short *)((long)asStack_19c + lVar41 + 2);
                        sVar7 = *(short *)((long)&local_198.data + lVar41);
                        *(short *)&pMVar31->data = sVar5 * 6;
                        *(short *)((long)&pMVar31->data + 2) = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                        *(short *)((long)&pMVar31->data + 4) = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                        *(short *)((long)&pMVar31->data + 6) = sVar5 + sVar6 * 2 + sVar7 * 4;
                        *(short *)&pMVar31->refcount = sVar5 + sVar6 * -2 + sVar7 * 4;
                        *(short *)((long)&pMVar31->refcount + 2) = sVar7 * 6;
                        pMVar31 = (Mat *)((long)&pMVar31->refcount + 4);
                        lVar41 = lVar41 + 6;
                      } while (lVar41 != 0x28);
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar14);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar47);
              }
              local_198.w = (this->weight_winograd43_data).w;
              local_198.elemsize = (this->weight_winograd43_data).elemsize;
              local_198.h = (this->weight_winograd43_data).h;
              local_198.elempack = (this->weight_winograd43_data).elempack;
              local_198.allocator = (this->weight_winograd43_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 |
                                             uVar50 & 0xffffffff) / (long)(int)local_1d8) +
                           (this->weight_winograd43_data).cstep * local_250 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(pMVar20,&local_198,0x24,uVar47,uVar14);
              uVar50 = uVar50 + uVar45;
              uVar21 = uVar45;
            } while ((long)uVar50 < (long)(int)uVar12);
          }
          local_250 = local_250 + 1;
        } while (local_250 != (uVar32 & 0xffffffff));
      }
      piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar9 == (int *)0x0) goto LAB_001816df;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_001816df;
      if (local_118.allocator != (Allocator *)0x0) {
        (*(local_118.allocator)->_vptr_Allocator[3])();
        goto LAB_001816df;
      }
    }
    else {
      get_optimal_tile_mnk_int8
                (uVar30,0,uVar12,(int *)&local_204,&local_11c,(int *)&local_1cc,opt->num_threads);
      uVar32 = (long)(int)((uVar30 - 1) + local_204) / (long)(int)local_204;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      Mat::create(&local_118,local_1cc * local_204 * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      iVar13 = (int)uVar32;
      Mat::create(&this->weight_winograd23_data,local_1cc * local_204,0x10,
                  (int)(uVar12 + local_1cc + -1) / (int)local_1cc,iVar13,2,(Allocator *)0x0);
      if (0 < iVar13) {
        local_1d8 = uVar32 & 0xffffffff;
        local_248 = 0;
        do {
          iVar13 = get_omp_thread_num();
          if (0 < (int)uVar12) {
            lVar41 = local_248 * local_204;
            pMVar20 = (Mat *)((long)iVar13 * local_118.cstep * local_118.elemsize +
                             (long)local_118.data);
            local_1b8._0_8_ = lVar41;
            uVar47 = uVar30 - (int)lVar41;
            uVar32 = (ulong)uVar47;
            if ((int)local_204 < (int)uVar47) {
              uVar32 = (ulong)local_204;
            }
            uVar45 = 0;
            do {
              uVar47 = uVar12 - (int)uVar45;
              if ((int)local_1cc < (int)uVar47) {
                uVar47 = local_1cc;
              }
              if (0 < (int)uVar32) {
                pvVar39 = local_138->data;
                uVar21 = 0;
                pMVar31 = pMVar20;
                do {
                  if (0 < (int)uVar47) {
                    uVar50 = 0;
                    do {
                      pcVar38 = (char *)((long)pvVar39 +
                                        (uVar50 + uVar45) * 9 +
                                        (long)(int)((local_1b8._0_4_ + (int)uVar21) * uVar12 * 9));
                      lVar41 = 0;
                      do {
                        cVar2 = *pcVar38;
                        cVar3 = pcVar38[1];
                        cVar4 = pcVar38[2];
                        *(short *)((long)&local_198.data + lVar41 * 2) = cVar2 * 2;
                        *(short *)((long)&local_198.data + lVar41 * 2 + 6) =
                             (short)cVar3 + (short)cVar2 + (short)cVar4;
                        *(short *)((long)&local_198.refcount + lVar41 * 2 + 4) =
                             ((short)cVar2 - (short)cVar3) + (short)cVar4;
                        *(short *)((long)&local_198.elemsize + lVar41 * 2 + 2) =
                             (short)cVar4 + (short)cVar4;
                        pcVar38 = pcVar38 + 3;
                        lVar41 = lVar41 + 1;
                      } while (lVar41 != 3);
                      lVar41 = 4;
                      do {
                        sVar5 = *(short *)((long)asStack_19c + lVar41);
                        sVar6 = *(short *)((long)asStack_19c + lVar41 + 2);
                        sVar7 = *(short *)((long)&local_198.data + lVar41);
                        *(short *)&pMVar31->data = sVar5 * 2;
                        *(short *)((long)&pMVar31->data + 2) = sVar6 + sVar5 + sVar7;
                        *(short *)((long)&pMVar31->data + 4) = (sVar5 - sVar6) + sVar7;
                        *(short *)((long)&pMVar31->data + 6) = sVar7 * 2;
                        pMVar31 = (Mat *)&pMVar31->refcount;
                        lVar41 = lVar41 + 6;
                      } while (lVar41 != 0x1c);
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar47);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar32);
              }
              local_198.w = (this->weight_winograd23_data).w;
              local_198.elemsize = (this->weight_winograd23_data).elemsize;
              local_198.h = (this->weight_winograd23_data).h;
              local_198.elempack = (this->weight_winograd23_data).elempack;
              local_198.allocator = (this->weight_winograd23_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 |
                                             uVar45 & 0xffffffff) / (long)(int)local_1cc) +
                           (this->weight_winograd23_data).cstep * local_248 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(pMVar20,&local_198,0x10,(int)uVar32,uVar47);
              uVar45 = uVar45 + (long)(int)local_1cc;
            } while ((long)uVar45 < (long)(int)uVar12);
          }
          local_248 = local_248 + 1;
        } while (local_248 != local_1d8);
      }
      piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar9 == (int *)0x0) goto LAB_001816df;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_001816df;
      if (local_118.allocator != (Allocator *)0x0) {
        (*(local_118.allocator)->_vptr_Allocator[3])();
        goto LAB_001816df;
      }
    }
  }
  else {
    if (opt->use_sgemm_convolution != true) {
      pMVar20 = &this->weight_data_tm;
      auVar74 = vpbroadcastd_avx512f(auVar52);
      uVar32 = (ulong)uVar47;
      local_98 = vmovdqu64_avx512f(auVar74);
      local_1c8 = ZEXT416(uVar47);
      local_1d8 = uVar32;
      if ((int)uVar30 < 0x10) {
        auVar52 = in_ZMM2._0_16_;
        uVar14 = uVar12;
        if ((int)uVar30 < 8) {
          if ((int)uVar30 < 4) {
            if ((int)uVar30 < 2) {
              uVar15 = uVar30;
              if ((int)uVar12 < 0x10) {
                if ((int)uVar12 < 8) {
                  if (1 < (int)uVar12) {
                    iVar13 = (int)(uVar50 >> 1);
                    sVar35 = 2;
                    iVar29 = 2;
                    uVar14 = uVar30;
                    goto LAB_0018070f;
                  }
                  sVar35 = 1;
                  iVar13 = 1;
                  goto LAB_0018076a;
                }
                iVar13 = (uVar12 & 1) + ((uint)(uVar50 >> 1) & 3) + 1;
                sVar35 = 8;
                iVar29 = 8;
              }
              else {
                iVar13 = (uVar12 & 1) + (int)(uVar50 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
                         ((uint)(uVar50 >> 1) & 3);
                sVar35 = 0x10;
                iVar29 = 0x10;
              }
              goto LAB_00180657;
            }
            if (0xf < (int)uVar12) {
              iVar29 = (uVar12 & 1) + ((uint)(uVar45 >> 4) & 0xfffffff) +
                       (uint)((uVar12 >> 3 & 1) != 0) + ((uint)(uVar50 >> 1) & 3);
              iVar13 = (uVar30 & 1) + 1;
              goto LAB_0017f3e8;
            }
            if ((int)uVar12 < 8) {
              if ((int)uVar12 < 2) {
                sVar35 = 2;
                iVar13 = 2;
                uVar15 = (uVar30 & 1) + 1;
                goto LAB_0018076a;
              }
              iVar13 = (int)(uVar50 >> 1);
              sVar35 = 4;
              iVar29 = 4;
              uVar14 = (uVar30 & 1) + 1;
LAB_0018070f:
              auVar74 = ZEXT1664(auVar52);
              Mat::create(pMVar20,uVar47,uVar12 - iVar13,uVar14,sVar35,iVar29,(Allocator *)0x0);
              goto LAB_00180775;
            }
            iVar29 = (uVar12 & 1) + ((uint)(uVar45 >> 1) & 3) + 1;
            iVar13 = (uVar30 & 1) + 1;
            sVar35 = 0x10;
            iVar17 = 0x10;
          }
          else {
            if (0xf < (int)uVar12) {
              iVar13 = (uVar12 & 1) + ((uint)(uVar45 >> 4) & 0xfffffff) +
                       (uint)((uVar12 >> 3 & 1) != 0) + ((uint)(uVar50 >> 1) & 3);
              uVar15 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
              goto LAB_0017f307;
            }
            if ((int)uVar12 < 8) {
              if (1 < (int)uVar12) {
                uVar14 = uVar12 - ((uint)(uVar45 >> 1) & 0x7fffffff);
                uVar15 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
                goto LAB_00180611;
              }
              sVar35 = 4;
              iVar13 = 4;
              uVar15 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
              goto LAB_0018076a;
            }
            iVar29 = (uVar12 & 1) + ((uint)(uVar45 >> 1) & 3) + 1;
            iVar13 = (uVar30 & 1) + 1 + (uint)((uVar30 >> 1 & 1) != 0);
LAB_0017f3e8:
            sVar35 = 0x20;
            iVar17 = 0x20;
          }
          auVar74 = ZEXT1664(auVar52);
          Mat::create(pMVar20,uVar47,iVar29,iVar13,sVar35,iVar17,(Allocator *)0x0);
          auVar76 = vmovdqu64_avx512f(local_98);
          uVar50 = 0;
        }
        else {
          if ((int)uVar12 < 0x10) {
            if ((int)uVar12 < 8) {
              if ((int)uVar12 < 2) {
                uVar15 = (uVar30 & 1) + 1 + ((uint)(uVar21 >> 2) & 1) +
                         (uint)((uVar30 >> 1 & 1) != 0);
LAB_00180611:
                sVar35 = 8;
                iVar13 = 8;
              }
              else {
                sVar35 = 0x10;
                iVar13 = 0x10;
                uVar14 = uVar12 - ((uint)(uVar45 >> 1) & 0x7fffffff);
                uVar15 = (uVar30 & 1) + 1 + (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
              }
LAB_0018076a:
              auVar74 = ZEXT1664(auVar52);
              Mat::create(pMVar20,uVar47,uVar14,uVar15,sVar35,iVar13,(Allocator *)0x0);
LAB_00180775:
              uVar50 = 0;
              auVar76 = vmovdqu64_avx512f(local_98);
              goto LAB_00180788;
            }
            iVar13 = (uVar12 & 1) + ((uint)(uVar45 >> 1) & 3) + 1;
            uVar15 = (uVar30 & 1) + 1 + ((uint)(uVar21 >> 2) & 1) + (uint)((uVar30 >> 1 & 1) != 0);
LAB_0017f307:
            sVar35 = 0x40;
            iVar29 = 0x40;
          }
          else {
            iVar13 = (uVar12 & 1) + ((uint)(uVar45 >> 4) & 0xfffffff) +
                     (uint)((uVar12 >> 3 & 1) != 0) + ((uint)(uVar50 >> 1) & 3);
            sVar35 = 0x80;
            iVar29 = 0x80;
            uVar15 = (uVar30 & 1) + 1 + (uVar30 >> 2 & 1) + (uint)((uVar30 >> 1 & 1) != 0);
          }
LAB_00180657:
          auVar74 = ZEXT1664(auVar52);
          Mat::create(pMVar20,uVar47,iVar13,uVar15,sVar35,iVar29,(Allocator *)0x0);
          auVar76 = vmovdqu64_avx512f(local_98);
          uVar50 = 0;
        }
      }
      else {
        if ((int)uVar12 < 0x10) {
          if ((int)uVar12 < 8) {
            if ((int)uVar12 < 2) {
              iVar13 = (uVar30 & 1) + ((uint)(uVar21 >> 4) & 0xfffffff) +
                       (uint)((uVar30 >> 3 & 1) != 0) + (uVar30 >> 2 & 1) +
                       (uint)((uVar30 >> 1 & 1) != 0);
              sVar35 = 0x10;
              iVar29 = 0x10;
              uVar14 = uVar12;
            }
            else {
              iVar13 = (uVar30 & 1) + ((uint)(uVar21 >> 4) & 0xfffffff) +
                       (uint)((uVar30 >> 3 & 1) != 0) + (uVar30 >> 2 & 1) +
                       (uint)((uVar30 >> 1 & 1) != 0);
              sVar35 = 0x20;
              iVar29 = 0x20;
              uVar14 = uVar12 - ((uint)(uVar45 >> 1) & 0x7fffffff);
            }
          }
          else {
            iVar13 = (uVar30 & 1) + ((uint)(uVar21 >> 4) & 0xfffffff) +
                     (uint)((uVar30 >> 3 & 1) != 0) + ((uint)(uVar21 >> 2) & 1) +
                     (uint)((uVar30 >> 1 & 1) != 0);
            sVar35 = 0x80;
            iVar29 = 0x80;
            uVar14 = (uVar12 & 1) + ((uint)(uVar45 >> 1) & 3) + 1;
          }
        }
        else {
          iVar13 = (uVar30 & 1) + (uVar30 >> 4) + (uint)((uVar30 >> 3 & 1) != 0) +
                   ((uint)(uVar21 >> 2) & 1) + (uint)((uVar30 >> 1 & 1) != 0);
          sVar35 = 0x100;
          iVar29 = 0x100;
          uVar14 = (uVar12 & 1) + ((uint)(uVar45 >> 4) & 0xfffffff) + (uint)((uVar12 >> 3 & 1) != 0)
                   + ((uint)(uVar50 >> 1) & 3);
        }
        auVar78 = ZEXT1664(in_ZMM9._0_16_);
        auVar79 = ZEXT1664(in_ZMM10._0_16_);
        auVar80 = ZEXT1664(in_ZMM11._0_16_);
        auVar81 = ZEXT1664(in_ZMM12._0_16_);
        auVar82 = ZEXT1664(in_ZMM13._0_16_);
        auVar83 = ZEXT1664(in_ZMM14._0_16_);
        auVar84 = ZEXT1664(in_ZMM15._0_16_);
        Mat::create(pMVar20,uVar47,uVar14,iVar13,sVar35,iVar29,(Allocator *)0x0);
        uVar14 = uVar12 * uVar47;
        local_c0 = (ulong)uVar14;
        auVar75 = vpmovsxbd_avx512f(_DAT_005a90e0);
        auVar76 = vmovdqu64_avx512f(local_98);
        vpmulld_avx512f(auVar76,auVar75);
        local_128 = (long)(int)(uVar47 << 4);
        _local_1b8 = vpmulld_avx512vl(auVar76._0_32_,auVar75._0_32_);
        local_130 = (ulong)(int)(uVar47 * 8);
        auVar77 = vpbroadcastd_avx512f();
        auVar52 = vpunpckldq_avx(auVar77._0_16_,ZEXT416(uVar14 + uVar47));
        auVar51 = vshufps_avx512vl(local_1c8,auVar52,0x41);
        auVar52 = vpbroadcastd_avx512vl();
        auVar52 = vpaddd_avx(auVar52,auVar51);
        auVar94 = ZEXT1664(auVar52);
        auVar72._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51;
        auVar72._16_16_ = ZEXT116(1) * auVar52;
        auVar71 = vpbroadcastd_avx512vl();
        auVar98 = ZEXT3264(auVar71);
        auVar71 = vpaddd_avx2(auVar71,auVar72);
        auVar96 = ZEXT3264(auVar71);
        auVar74 = vinserti32x4_avx512f(ZEXT1664(auVar51),auVar52,1);
        vinserti64x4_avx512f(auVar74,auVar71,1);
        local_b0 = (long)(int)(uVar47 * 2);
        vpmulld_avx512f(auVar77,auVar75);
        local_b8 = CONCAT44(local_b8._4_4_,uVar12) & 0xfffffffffffffff0;
        uVar50 = 0;
        do {
          local_a8 = uVar50;
          pvVar39 = (this->super_Convolution).weight_data.data;
          uVar15 = (uint)local_a8;
          local_220 = (long)(int)(uVar14 * uVar15) + (long)pvVar39;
          lVar41 = (long)(int)((uVar15 | 1) * uVar14) + (long)pvVar39;
          local_1e0 = (long)(int)((uVar15 | 2) * uVar14) + (long)pvVar39;
          local_200 = (long)(int)((uVar15 | 3) * uVar14) + (long)pvVar39;
          lVar49 = (long)(int)((uVar15 | 4) * uVar14) + (long)pvVar39;
          lVar22 = (long)(int)((uVar15 | 5) * uVar14) + (long)pvVar39;
          lVar23 = (long)(int)((uVar15 | 6) * uVar14) + (long)pvVar39;
          lVar24 = (long)(int)((uVar15 | 7) * uVar14) + (long)pvVar39;
          lVar34 = (long)(int)((uVar15 | 8) * uVar14) + (long)pvVar39;
          lVar25 = (long)(int)((uVar15 | 9) * uVar14) + (long)pvVar39;
          lVar26 = (long)(int)((uVar15 | 10) * uVar14) + (long)pvVar39;
          lVar27 = (long)(int)((uVar15 | 0xb) * uVar14) + (long)pvVar39;
          lVar28 = (long)(int)((uVar15 | 0xc) * uVar14) + (long)pvVar39;
          local_1e8 = (long)(int)((uVar15 | 0xd) * uVar14) + (long)pvVar39;
          local_1f0 = (long)(int)((uVar15 | 0xe) * uVar14) + (long)pvVar39;
          local_1f8 = (long)(int)((uVar15 | 0xf) * uVar14) + (long)pvVar39;
          pauVar42 = (undefined1 (*) [16])
                     ((local_a8 >> 4) * (this->weight_data_tm).cstep *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          if ((int)uVar12 < 0x10) {
            local_148 = 0;
          }
          else {
            iVar13 = 0;
            do {
              if (0 < (int)uVar47) {
                uVar32 = 0;
                do {
                  auVar94 = vpgatherdd_avx512f(*(undefined4 *)(local_220 + uVar32 + local_1d8));
                  auVar96 = vpgatherdd_avx512f(*(undefined4 *)(uVar32 + lVar41 + local_1d8));
                  auVar98 = vpgatherdd_avx512f(*(undefined4 *)(local_1e0 + uVar32 + local_1d8));
                  auVar78 = vpgatherdd_avx512f(*(undefined4 *)(local_200 + uVar32 + local_1d8));
                  auVar79 = vpgatherdd_avx512f(*(undefined4 *)(lVar49 + uVar32 + local_1d8));
                  auVar80 = vpgatherdd_avx512f(*(undefined4 *)(lVar22 + uVar32 + local_1d8));
                  auVar81 = vpgatherdd_avx512f(*(undefined4 *)(lVar23 + uVar32 + local_1d8));
                  auVar82 = vpgatherdd_avx512f(*(undefined4 *)(lVar24 + uVar32 + local_1d8));
                  auVar83 = vpgatherdd_avx512f(*(undefined4 *)(lVar34 + uVar32 + local_1d8));
                  auVar84 = vpgatherdd_avx512f(*(undefined4 *)(lVar25 + uVar32 + local_1d8));
                  auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar26 + uVar32 + local_1d8));
                  auVar85 = vpgatherdd_avx512f(*(undefined4 *)(lVar27 + uVar32 + local_1d8));
                  vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                  auVar86 = vpgatherdd_avx512f(*(undefined4 *)(lVar28 + uVar32 + local_1d8));
                  vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
                  auVar87 = vpgatherdd_avx512f(*(undefined4 *)(local_1e8 + uVar32 + local_1d8));
                  vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                  auVar88 = vpgatherdd_avx512f(*(undefined4 *)(local_1f0 + uVar32 + local_1d8));
                  vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                  auVar89 = vpgatherdd_avx512f(*(undefined4 *)(local_1f8 + uVar32 + local_1d8));
                  auVar52 = vpmovdb_avx512f(auVar94);
                  auVar51 = vpmovdb_avx512f(auVar96);
                  auVar53 = vpmovdb_avx512f(auVar98);
                  auVar54 = vpmovdb_avx512f(auVar78);
                  auVar55 = vpmovdb_avx512f(auVar79);
                  auVar56 = vpmovdb_avx512f(auVar80);
                  auVar57 = vpmovdb_avx512f(auVar81);
                  auVar58 = vpmovdb_avx512f(auVar82);
                  auVar59 = vpmovdb_avx512f(auVar83);
                  auVar60 = vpmovdb_avx512f(auVar84);
                  auVar61 = vpmovdb_avx512f(auVar77);
                  auVar62 = vpmovdb_avx512f(auVar85);
                  auVar63 = vpmovdb_avx512f(auVar86);
                  auVar64 = vpmovdb_avx512f(auVar87);
                  auVar65 = vpmovdb_avx512f(auVar88);
                  auVar66 = vpmovdb_avx512f(auVar89);
                  auVar67 = vpunpcklwd_avx512vl(auVar52,auVar51);
                  auVar52 = vpunpckhwd_avx(auVar52,auVar51);
                  auVar70 = vpunpcklwd_avx(auVar53,auVar54);
                  auVar51 = vpunpckhwd_avx(auVar53,auVar54);
                  auVar69 = vpunpcklwd_avx(auVar55,auVar56);
                  auVar53 = vpunpckhwd_avx(auVar55,auVar56);
                  auVar68 = vpunpcklwd_avx(auVar57,auVar58);
                  auVar54 = vpunpckhwd_avx(auVar57,auVar58);
                  auVar57 = vpunpcklwd_avx(auVar59,auVar60);
                  auVar55 = vpunpckhwd_avx(auVar59,auVar60);
                  auVar58 = vpunpcklwd_avx(auVar61,auVar62);
                  auVar56 = vpunpckhwd_avx(auVar61,auVar62);
                  auVar59 = vpunpcklwd_avx512vl(auVar63,auVar64);
                  auVar60 = vpunpckhwd_avx512vl(auVar63,auVar64);
                  auVar61 = vpunpcklwd_avx512vl(auVar65,auVar66);
                  auVar62 = vpunpckhwd_avx512vl(auVar65,auVar66);
                  auVar63 = vpunpckldq_avx512vl(auVar67,auVar70);
                  auVar64 = vpunpckhdq_avx512vl(auVar67,auVar70);
                  auVar65 = vpunpckldq_avx512vl(auVar52,auVar51);
                  auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                  auVar70 = vpunpckldq_avx(auVar69,auVar68);
                  auVar51 = vpunpckhdq_avx(auVar69,auVar68);
                  auVar69 = vpunpckldq_avx(auVar53,auVar54);
                  auVar53 = vpunpckhdq_avx(auVar53,auVar54);
                  auVar68 = vpunpckldq_avx(auVar57,auVar58);
                  auVar54 = vpunpckhdq_avx(auVar57,auVar58);
                  auVar57 = vpunpckldq_avx(auVar55,auVar56);
                  auVar55 = vpunpckhdq_avx(auVar55,auVar56);
                  auVar81 = ZEXT1664(auVar55);
                  auVar56 = vpunpckldq_avx512vl(auVar59,auVar61);
                  auVar58 = vpunpckhdq_avx512vl(auVar59,auVar61);
                  auVar59 = vpunpckldq_avx512vl(auVar60,auVar62);
                  auVar60 = vpunpckhdq_avx512vl(auVar60,auVar62);
                  in_ZMM16 = ZEXT1664(auVar60);
                  auVar61 = vpunpcklqdq_avx512vl(auVar63,auVar70);
                  in_ZMM18 = ZEXT1664(auVar61);
                  auVar62 = vpunpcklqdq_avx512vl(auVar68,auVar56);
                  auVar63 = vpunpckhqdq_avx512vl(auVar63,auVar70);
                  auVar96 = ZEXT1664(auVar63);
                  auVar56 = vpunpckhqdq_avx(auVar68,auVar56);
                  auVar79 = ZEXT1664(auVar56);
                  auVar70 = vpunpcklqdq_avx(auVar64,auVar51);
                  auVar83 = ZEXT1664(auVar70);
                  auVar68 = vpunpcklqdq_avx512vl(auVar54,auVar58);
                  in_ZMM19 = ZEXT1664(auVar68);
                  auVar51 = vpunpckhqdq_avx(auVar64,auVar51);
                  auVar94 = ZEXT1664(auVar51);
                  auVar54 = vpunpckhqdq_avx(auVar54,auVar58);
                  auVar98 = ZEXT1664(auVar54);
                  auVar58 = vpunpcklqdq_avx512vl(auVar65,auVar69);
                  auVar80 = ZEXT1664(auVar58);
                  auVar64 = vpunpcklqdq_avx512vl(auVar57,auVar59);
                  auVar84 = ZEXT1664(auVar64);
                  auVar69 = vpunpckhqdq_avx512vl(auVar65,auVar69);
                  auVar78 = ZEXT1664(auVar69);
                  auVar57 = vpunpckhqdq_avx512vl(auVar57,auVar59);
                  auVar82 = ZEXT1664(auVar57);
                  auVar59 = vpunpcklqdq_avx512vl(auVar52,auVar53);
                  in_ZMM17 = ZEXT1664(auVar59);
                  auVar65 = vpunpcklqdq_avx512vl(auVar55,auVar60);
                  auVar53 = vpunpckhqdq_avx(auVar52,auVar53);
                  auVar55 = vpunpckhqdq_avx512vl(auVar55,auVar60);
                  auVar52 = vmovdqu64_avx512vl(auVar61);
                  *pauVar42 = auVar52;
                  auVar52 = vmovdqu64_avx512vl(auVar62);
                  pauVar42[1] = auVar52;
                  pauVar42[2] = auVar63;
                  pauVar42[3] = auVar56;
                  pauVar42[4] = auVar70;
                  auVar52 = vmovdqu64_avx512vl(auVar68);
                  pauVar42[5] = auVar52;
                  pauVar42[6] = auVar51;
                  pauVar42[7] = auVar54;
                  pauVar42[8] = auVar58;
                  pauVar42[9] = auVar64;
                  pauVar42[10] = auVar69;
                  pauVar42[0xb] = auVar57;
                  auVar52 = vmovdqu64_avx512vl(auVar59);
                  pauVar42[0xc] = auVar52;
                  auVar52 = vmovdqu64_avx512vl(auVar65);
                  pauVar42[0xd] = auVar52;
                  pauVar42[0xe] = auVar53;
                  pauVar42[0xf] = auVar55;
                  pauVar42 = pauVar42 + 0x10;
                  uVar32 = uVar32 + 1;
                } while (local_1d8 != uVar32);
              }
              local_220 = local_220 + local_128;
              lVar41 = lVar41 + local_128;
              local_1e0 = local_1e0 + local_128;
              local_200 = local_200 + local_128;
              lVar49 = lVar49 + local_128;
              lVar22 = lVar22 + local_128;
              lVar23 = lVar23 + local_128;
              lVar24 = lVar24 + local_128;
              lVar34 = lVar34 + local_128;
              lVar25 = lVar25 + local_128;
              lVar26 = lVar26 + local_128;
              lVar27 = lVar27 + local_128;
              lVar28 = lVar28 + local_128;
              local_1e8 = local_1e8 + local_128;
              local_1f0 = local_1f0 + local_128;
              local_1f8 = local_1f8 + local_128;
              iVar29 = iVar13 + 0x1f;
              iVar13 = iVar13 + 0x10;
            } while (iVar29 < (int)uVar12);
            local_148 = uVar45 & 0xfffffff0;
            local_140 = lVar41;
          }
          uVar15 = (uint)local_148 | 7;
          while (uVar16 = (uint)local_148, (int)uVar15 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar32 = 0;
              do {
                auVar71 = vpcmpeqd_avx2(auVar94._0_32_,auVar94._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar72 = vmovdqa64_avx512vl(auVar71);
                in_ZMM16 = ZEXT3264(auVar72);
                auVar71 = vpcmpeqd_avx2(auVar96._0_32_,auVar96._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar73 = vmovdqa64_avx512vl(auVar71);
                in_ZMM17 = ZEXT3264(auVar73);
                auVar71 = vpcmpeqd_avx2(auVar98._0_32_,auVar98._0_32_);
                auVar95 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(_local_1b8,_local_1b8);
                auVar97 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar78._0_32_,auVar78._0_32_);
                auVar99 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar79._0_32_,auVar79._0_32_);
                auVar100 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar80._0_32_,auVar80._0_32_);
                auVar101 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar81._0_32_,auVar81._0_32_);
                auVar102 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar82._0_32_,auVar82._0_32_);
                auVar103 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar83._0_32_,auVar83._0_32_);
                auVar105 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar84._0_32_,auVar84._0_32_);
                auVar107 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                auVar108 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(auVar74._0_32_,auVar74._0_32_);
                auVar93 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(_local_1b8,_local_1b8);
                auVar92 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(_local_1b8,_local_1b8);
                auVar90 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar71 = vpcmpeqd_avx2(_local_1b8,_local_1b8);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar52 = vpmovdb_avx512vl(auVar72);
                auVar51 = vpmovdb_avx512vl(auVar73);
                auVar53 = vpmovdb_avx512vl(auVar95);
                auVar54 = vpmovdb_avx512vl(auVar97);
                auVar55 = vpmovdb_avx512vl(auVar99);
                auVar56 = vpmovdb_avx512vl(auVar100);
                auVar70 = vpmovdb_avx512vl(auVar101);
                auVar79 = ZEXT864(auVar70._0_8_);
                auVar69 = vpmovdb_avx512vl(auVar102);
                auVar80 = ZEXT864(auVar69._0_8_);
                auVar68 = vpmovdb_avx512vl(auVar103);
                auVar81 = ZEXT864(auVar68._0_8_);
                auVar57 = vpmovdb_avx512vl(auVar105);
                auVar82 = ZEXT864(auVar57._0_8_);
                auVar58 = vpmovdb_avx512vl(auVar107);
                auVar83 = ZEXT864(auVar58._0_8_);
                auVar59 = vpmovdb_avx512vl(auVar108);
                auVar84 = ZEXT864(auVar59._0_8_);
                auVar60 = vpmovdb_avx512vl(auVar93);
                auVar61 = vpmovdb_avx512vl(auVar92);
                auVar62._8_8_ = 0;
                auVar62._0_8_ = auVar52._0_8_;
                auVar52._8_8_ = 0;
                auVar52._0_8_ = auVar51._0_8_;
                auVar52 = vpunpcklwd_avx(auVar62,auVar52);
                auVar63._8_8_ = 0;
                auVar63._0_8_ = auVar53._0_8_;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = auVar54._0_8_;
                auVar51 = vpunpcklwd_avx(auVar63,auVar64);
                auVar65._8_8_ = 0;
                auVar65._0_8_ = auVar55._0_8_;
                auVar55._8_8_ = 0;
                auVar55._0_8_ = auVar56._0_8_;
                auVar53 = vpunpcklwd_avx(auVar65,auVar55);
                auVar56._8_8_ = 0;
                auVar56._0_8_ = auVar70._0_8_;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = auVar69._0_8_;
                auVar54 = vpunpcklwd_avx(auVar56,auVar66);
                auVar67._8_8_ = 0;
                auVar67._0_8_ = auVar68._0_8_;
                auVar104._8_8_ = 0;
                auVar104._0_8_ = auVar57._0_8_;
                auVar55 = vpunpcklwd_avx(auVar67,auVar104);
                auVar106._8_8_ = 0;
                auVar106._0_8_ = auVar58._0_8_;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = auVar59._0_8_;
                auVar56 = vpunpcklwd_avx(auVar106,auVar58);
                auVar78 = ZEXT1664(auVar56);
                auVar70._8_8_ = 0;
                auVar70._0_8_ = auVar61._0_8_;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = auVar60._0_8_;
                auVar70 = vpunpcklwd_avx(auVar68,auVar70);
                auVar69 = vpmovdb_avx512vl(auVar90);
                auVar68 = vpmovdb_avx512vl(auVar71);
                auVar57._8_8_ = 0;
                auVar57._0_8_ = auVar69._0_8_;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = auVar68._0_8_;
                auVar69 = vpunpcklwd_avx(auVar57,auVar69);
                auVar68 = vpunpckldq_avx(auVar52,auVar51);
                auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                auVar57 = vpunpckldq_avx(auVar55,auVar56);
                auVar51 = vpunpckhdq_avx(auVar55,auVar56);
                auVar94 = ZEXT1664(auVar51);
                auVar55 = vpunpckldq_avx(auVar53,auVar54);
                auVar53 = vpunpckhdq_avx(auVar53,auVar54);
                auVar56 = vpunpckldq_avx(auVar70,auVar69);
                auVar54 = vpunpckhdq_avx(auVar70,auVar69);
                auVar70 = vpunpcklqdq_avx(auVar68,auVar55);
                auVar74 = ZEXT1664(auVar70);
                auVar55 = vpunpckhqdq_avx(auVar68,auVar55);
                auVar69 = vpunpcklqdq_avx(auVar52,auVar53);
                auVar52 = vpunpckhqdq_avx(auVar52,auVar53);
                auVar75 = ZEXT1664(auVar52);
                auVar68 = vpunpcklqdq_avx(auVar57,auVar56);
                auVar96 = ZEXT1664(auVar68);
                auVar53 = vpunpckhqdq_avx(auVar57,auVar56);
                auVar56 = vpunpcklqdq_avx(auVar51,auVar54);
                auVar98 = ZEXT1664(auVar56);
                auVar51 = vpunpckhqdq_avx(auVar51,auVar54);
                *pauVar42 = auVar70;
                pauVar42[1] = auVar68;
                pauVar42[2] = auVar55;
                pauVar42[3] = auVar53;
                pauVar42[4] = auVar69;
                pauVar42[5] = auVar56;
                pauVar42[6] = auVar52;
                pauVar42[7] = auVar51;
                pauVar42 = pauVar42 + 8;
                uVar32 = uVar32 + 1;
              } while (local_1d8 != uVar32);
            }
            local_220 = local_220 + local_130;
            lVar41 = lVar41 + local_130;
            local_1e0 = local_1e0 + local_130;
            local_200 = local_200 + local_130;
            lVar34 = lVar34 + local_130;
            local_1e8 = local_1e8 + local_130;
            local_1f0 = local_1f0 + local_130;
            local_1f8 = local_1f8 + local_130;
            local_148 = (ulong)(uVar16 + 8);
            local_140 = lVar41;
            uVar15 = uVar16 + 0xf;
          }
          uVar16 = uVar16 | 1;
          uVar32 = local_148;
          while (iVar13 = (int)uVar32, (int)uVar16 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar77 = vpgatherdd_avx512f(*(undefined4 *)(local_220 + uVar50 + uVar32));
                auVar85 = vpgatherdd_avx512f(*(undefined4 *)(lVar34 + uVar50 + uVar32));
                auVar52 = vpmovdb_avx512f(auVar77);
                *pauVar42 = auVar52;
                auVar52 = vpmovdb_avx512f(auVar85);
                pauVar42[1] = auVar52;
                pauVar42 = pauVar42 + 2;
                uVar50 = uVar50 + 1;
              } while (local_1d8 != uVar50);
            }
            local_220 = local_220 + local_b0;
            lVar34 = lVar34 + local_b0;
            uVar32 = (ulong)(iVar13 + 2);
            uVar16 = iVar13 + 3;
          }
          if (iVar13 < (int)uVar12) {
            do {
              lVar41 = local_220;
              uVar50 = local_1d8;
              if (0 < (int)uVar47) {
                do {
                  auVar77 = vpgatherdd_avx512f(*(undefined4 *)(lVar41 + local_220));
                  auVar52 = vpmovdb_avx512f(auVar77);
                  *pauVar42 = auVar52;
                  pauVar42 = pauVar42 + 1;
                  lVar41 = lVar41 + 1;
                  uVar50 = uVar50 - 1;
                } while (uVar50 != 0);
              }
              uVar15 = (int)uVar32 + 1;
              uVar32 = (ulong)uVar15;
            } while (uVar15 != uVar12);
          }
          uVar50 = local_a8 + 0x10;
          uVar32 = local_1d8;
        } while (local_a8 + 0x1f < (ulong)uVar30);
      }
LAB_00180788:
      uVar14 = (uint)uVar50 | 7;
      local_c8 = (long)(int)uVar47;
      if ((int)uVar14 < (int)uVar30) {
        uVar15 = uVar12 * uVar47;
        local_48 = (ulong)uVar15;
        auVar74 = vpmovsxbd_avx512f(_DAT_005a90e0);
        vpmulld_avx512f(auVar76,auVar74);
        local_50 = (long)(int)(uVar47 << 4);
        local_38 = (long)(int)(uVar47 * 8);
        auVar72 = vpbroadcastd_avx512vl();
        auVar75 = ZEXT3264(auVar72);
        auVar52 = vpunpckldq_avx(auVar72._0_16_,ZEXT416(uVar15 + uVar47));
        auVar51 = vshufps_avx512vl(local_1c8,auVar52,0x41);
        auVar52 = vpbroadcastd_avx512vl();
        auVar52 = vpaddd_avx(auVar52,auVar51);
        auVar73._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51;
        auVar73._16_16_ = ZEXT116(1) * auVar52;
        auVar71 = vpbroadcastd_avx512vl();
        auVar71 = vpaddd_avx2(auVar71,auVar73);
        auVar94 = vinserti32x4_avx512f(ZEXT1664(auVar51),auVar52,1);
        vinserti64x4_avx512f(auVar94,auVar71,1);
        auVar71 = vpmulld_avx2(auVar72,auVar74._0_32_);
        auVar74 = ZEXT3264(auVar71);
        local_9c = uVar12 & 0xfffffff0;
        uVar50 = uVar50 & 0xffffffff;
        do {
          local_40 = uVar50;
          pvVar39 = (this->super_Convolution).weight_data.data;
          uVar16 = (uint)local_40;
          lVar23 = (long)(int)(uVar15 * uVar16) + (long)pvVar39;
          lVar26 = (long)(int)((uVar16 + 1) * uVar15) + (long)pvVar39;
          lVar22 = (long)(int)((uVar16 + 2) * uVar15) + (long)pvVar39;
          lVar41 = (long)(int)((uVar16 + 3) * uVar15) + (long)pvVar39;
          lVar28 = (long)(int)((uVar16 + 4) * uVar15) + (long)pvVar39;
          lVar24 = (long)(int)((uVar16 + 5) * uVar15) + (long)pvVar39;
          lVar27 = (long)(int)((uVar16 + 6) * uVar15) + (long)pvVar39;
          uVar50 = (long)(int)(uVar14 * uVar15) + (long)pvVar39;
          pauVar42 = (undefined1 (*) [16])
                     ((ulong)((uVar16 >> 4) + (uint)((uVar16 >> 3 & 1) != 0)) *
                      (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          lVar34 = lVar41;
          if ((int)uVar12 < 0x10) {
            uVar37 = 0;
          }
          else {
            iVar13 = 0;
            do {
              if (0 < (int)uVar47) {
                uVar37 = 0;
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar23 + uVar37 + lVar22));
                  auVar52 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar26 + uVar37 + lVar22));
                  auVar51 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar22 * 2 + uVar37));
                  auVar53 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar34 + uVar37 + lVar22));
                  auVar54 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar28 + uVar37 + lVar22));
                  auVar69 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar24 + uVar37 + lVar22));
                  auVar68 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar27 + uVar37 + lVar22));
                  auVar57 = vpmovdb_avx512f(auVar75);
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(uVar50 + uVar37 + lVar22));
                  auVar58 = vpmovdb_avx512f(auVar75);
                  auVar55 = vpunpcklwd_avx(auVar52,auVar51);
                  auVar52 = vpunpckhwd_avx(auVar52,auVar51);
                  auVar56 = vpunpcklwd_avx(auVar53,auVar54);
                  auVar51 = vpunpckhwd_avx(auVar53,auVar54);
                  auVar70 = vpunpcklwd_avx(auVar69,auVar68);
                  auVar53 = vpunpckhwd_avx(auVar69,auVar68);
                  auVar69 = vpunpcklwd_avx(auVar57,auVar58);
                  auVar54 = vpunpckhwd_avx(auVar57,auVar58);
                  auVar68 = vpunpckldq_avx(auVar55,auVar56);
                  auVar55 = vpunpckhdq_avx(auVar55,auVar56);
                  auVar56 = vpunpckldq_avx(auVar52,auVar51);
                  auVar52 = vpunpckhdq_avx(auVar52,auVar51);
                  auVar57 = vpunpckldq_avx(auVar70,auVar69);
                  auVar51 = vpunpckhdq_avx(auVar70,auVar69);
                  auVar70 = vpunpckldq_avx(auVar53,auVar54);
                  auVar53 = vpunpckhdq_avx(auVar53,auVar54);
                  auVar69 = vpunpcklqdq_avx(auVar68,auVar57);
                  auVar54 = vpunpckhqdq_avx(auVar68,auVar57);
                  auVar68 = vpunpcklqdq_avx(auVar55,auVar51);
                  auVar51 = vpunpckhqdq_avx(auVar55,auVar51);
                  auVar57 = vpunpcklqdq_avx(auVar56,auVar70);
                  auVar55 = vpunpckhqdq_avx(auVar56,auVar70);
                  auVar56 = vpunpcklqdq_avx(auVar52,auVar53);
                  auVar52 = vpunpckhqdq_avx(auVar52,auVar53);
                  auVar75 = ZEXT1664(auVar52);
                  *pauVar42 = auVar69;
                  pauVar42[1] = auVar54;
                  pauVar42[2] = auVar68;
                  pauVar42[3] = auVar51;
                  pauVar42[4] = auVar57;
                  pauVar42[5] = auVar55;
                  pauVar42[6] = auVar56;
                  pauVar42[7] = auVar52;
                  pauVar42 = pauVar42 + 8;
                  uVar37 = uVar37 + 1;
                } while (uVar32 != uVar37);
              }
              lVar23 = lVar23 + local_50;
              lVar26 = lVar26 + local_50;
              lVar22 = lVar22 + local_50;
              lVar34 = lVar34 + local_50;
              lVar28 = lVar28 + local_50;
              lVar24 = lVar24 + local_50;
              lVar27 = lVar27 + local_50;
              uVar50 = uVar50 + local_50;
              iVar29 = iVar13 + 0x1f;
              iVar13 = iVar13 + 0x10;
            } while (iVar29 < (int)uVar12);
            uVar37 = (ulong)local_9c;
          }
          lVar25 = lVar23;
          if ((int)((uint)uVar37 | 7) < (int)uVar12) {
            local_1e8 = local_c8 + uVar50;
            local_1f0 = lVar27 + local_c8;
            local_1f8 = lVar24 + local_c8;
            local_140 = lVar28 + local_c8;
            local_148 = lVar34 + local_c8;
            local_128 = lVar22 + local_c8;
            local_130 = lVar26 + local_c8;
            local_a8 = lVar23 + local_c8;
            local_c0 = 0;
            uVar33 = uVar37;
            do {
              if (0 < (int)uVar47) {
                uVar37 = 0;
                uVar32 = local_c0;
                do {
                  pauVar36 = pauVar42;
                  uVar43 = uVar32;
                  lVar41 = 0;
                  do {
                    lVar49 = lVar41;
                    (*pauVar36)[lVar49] = *(undefined1 *)(lVar23 + uVar43);
                    (*pauVar36)[lVar49 + 1] = *(undefined1 *)(local_a8 + uVar43);
                    (*pauVar36)[lVar49 + 2] = *(undefined1 *)(lVar26 + uVar43);
                    (*pauVar36)[lVar49 + 3] = *(undefined1 *)(local_130 + uVar43);
                    (*pauVar36)[lVar49 + 4] = *(undefined1 *)(lVar22 + uVar43);
                    (*pauVar36)[lVar49 + 5] = *(undefined1 *)(local_128 + uVar43);
                    (*pauVar36)[lVar49 + 6] = *(undefined1 *)(lVar34 + uVar43);
                    (*pauVar36)[lVar49 + 7] = *(undefined1 *)(local_148 + uVar43);
                    (*pauVar36)[lVar49 + 8] = *(undefined1 *)(lVar28 + uVar43);
                    (*pauVar36)[lVar49 + 9] = *(undefined1 *)(local_140 + uVar43);
                    (*pauVar36)[lVar49 + 10] = *(undefined1 *)(lVar24 + uVar43);
                    (*pauVar36)[lVar49 + 0xb] = *(undefined1 *)(local_1f8 + uVar43);
                    (*pauVar36)[lVar49 + 0xc] = *(undefined1 *)(lVar27 + uVar43);
                    (*pauVar36)[lVar49 + 0xd] = *(undefined1 *)(local_1f0 + uVar43);
                    (*pauVar36)[lVar49 + 0xe] = *(undefined1 *)(uVar50 + uVar43);
                    (*pauVar36)[lVar49 + 0xf] = *(undefined1 *)(local_1e8 + uVar43);
                    uVar43 = uVar43 + (long)(int)(uVar47 * 2);
                    lVar41 = lVar49 + 0x10;
                  } while ((int)(lVar49 + 0x10) != 0x40);
                  uVar37 = uVar37 + 1;
                  uVar32 = uVar32 + 1;
                  pauVar42 = (undefined1 (*) [16])(pauVar36[1] + lVar49);
                } while (uVar37 != local_1d8);
                pauVar42 = (undefined1 (*) [16])(pauVar36[1] + lVar49);
                uVar32 = local_1d8;
                local_b8 = uVar33;
                local_b0 = lVar25;
              }
              lVar25 = lVar25 + local_38;
              iVar13 = (int)uVar33;
              uVar14 = iVar13 + 8;
              uVar37 = (ulong)uVar14;
              local_c0 = local_c0 + local_38;
              uVar33 = (ulong)uVar14;
              local_200 = uVar50;
              local_1e0 = lVar28;
              lVar41 = lVar34;
            } while (iVar13 + 0xf < (int)uVar12);
          }
          local_1b8._0_8_ = lVar41;
          uVar14 = (uint)uVar37 | 1;
          while (iVar13 = (int)uVar37, (int)uVar14 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar75 = vpgatherdd_avx512f(*(undefined4 *)((lVar25 + uVar50) * 2));
                auVar52 = vpmovdb_avx512f(auVar75);
                *pauVar42 = auVar52;
                pauVar42 = pauVar42 + 1;
                uVar50 = uVar50 + 1;
              } while (uVar32 != uVar50);
            }
            lVar25 = lVar25 + (int)(uVar47 * 2);
            uVar37 = (ulong)(iVar13 + 2);
            uVar14 = iVar13 + 3;
          }
          if (iVar13 < (int)uVar12) {
            do {
              uVar50 = uVar32;
              if (0 < (int)uVar47) {
                do {
                  auVar71 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                  auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                  auVar75 = ZEXT3264((undefined1  [32])0x0);
                  auVar52 = vpmovdb_avx512vl(auVar71);
                  *(long *)*pauVar42 = auVar52._0_8_;
                  pauVar42 = (undefined1 (*) [16])(*pauVar42 + 8);
                  uVar50 = uVar50 - 1;
                } while (uVar50 != 0);
              }
              uVar14 = (int)uVar37 + 1;
              uVar37 = (ulong)uVar14;
            } while (uVar14 != uVar12);
          }
          uVar50 = local_40 + 8;
          uVar14 = (uint)(local_40 + 0xf);
        } while ((long)(local_40 + 0xf) < (long)uVar21);
      }
      uVar15 = (uint)uVar50;
      uVar14 = uVar15 | 3;
      if ((int)uVar14 < (int)uVar30) {
        uVar16 = uVar12 * uVar47;
        local_148 = (ulong)uVar16;
        lVar41 = (long)(int)(uVar47 << 4);
        local_1e0 = (long)(int)(uVar47 * 8);
        auVar51 = vpbroadcastd_avx512vl();
        auVar52 = vpunpckldq_avx(auVar51,ZEXT416(uVar16 + uVar47));
        auVar52 = vshufps_avx512vl(local_1c8,auVar52,0x41);
        auVar74 = ZEXT1664(auVar52);
        auVar53 = vpbroadcastd_avx512vl();
        vpaddd_avx(auVar53,auVar52);
        vpmulld_avx(auVar51,_DAT_005a8c50);
        local_130 = CONCAT44(local_130._4_4_,uVar12) & 0xfffffffffffffff0;
        iVar17 = uVar16 * uVar14;
        iVar13 = uVar16 * 4;
        local_128 = CONCAT44(local_128._4_4_,iVar13);
        iVar29 = (uVar15 + 2) * uVar16;
        iVar48 = (uVar15 + 1) * uVar16;
        uVar15 = uVar15 * uVar16;
        uVar50 = uVar50 & 0xffffffff;
        do {
          local_1f0 = uVar50;
          local_200 = (ulong)uVar15;
          uVar19 = (uint)local_1f0;
          pvVar39 = (this->super_Convolution).weight_data.data;
          local_230 = (long)(int)(uVar16 * uVar19) + (long)pvVar39;
          local_248 = (long)(int)((uVar19 + 1) * uVar16) + (long)pvVar39;
          lVar22 = (long)(int)((uVar19 + 2) * uVar16) + (long)pvVar39;
          lVar34 = (long)(int)(uVar14 * uVar16) + (long)pvVar39;
          local_260 = (undefined8 *)
                      ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                       (ulong)(((uint)(local_1f0 >> 3) & 1) + ((uint)(local_1f0 >> 4) & 0xfffffff) +
                              (uint)((uVar19 >> 2 & 1) != 0)) + (long)(this->weight_data_tm).data);
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar17);
          local_1f8 = CONCAT44(local_1f8._4_4_,iVar29);
          local_140 = CONCAT44(local_140._4_4_,iVar48);
          if ((int)uVar12 < 0x10) {
            uVar50 = 0;
          }
          else {
            lVar23 = 0;
            iVar18 = 0;
            do {
              if (0 < (int)uVar47) {
                auVar71._24_8_ = 0;
                auVar71._0_24_ = stack0xfffffffffffffe50;
                _local_1b8 = auVar71 << 0x40;
                lVar24 = lVar23;
                do {
                  puVar46 = local_260;
                  lVar27 = 0;
                  lVar26 = lVar24;
                  do {
                    *(undefined1 *)((long)puVar46 + lVar27) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + (int)uVar15);
                    *(undefined1 *)((long)puVar46 + lVar27 + 1) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + (int)uVar15 + local_c8);
                    *(undefined1 *)((long)puVar46 + lVar27 + 2) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar48);
                    *(undefined1 *)((long)puVar46 + lVar27 + 3) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar48 + local_c8);
                    *(undefined1 *)((long)puVar46 + lVar27 + 4) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar29);
                    *(undefined1 *)((long)puVar46 + lVar27 + 5) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar29 + local_c8);
                    *(undefined1 *)((long)puVar46 + lVar27 + 6) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar17);
                    *(undefined1 *)((long)puVar46 + lVar27 + 7) =
                         *(undefined1 *)((long)pvVar39 + lVar26 + iVar17 + local_c8);
                    lVar27 = lVar27 + 8;
                    lVar26 = lVar26 + (int)(uVar47 * 2);
                  } while ((int)lVar27 != 0x40);
                  uVar32 = local_1b8._0_8_ + 1;
                  lVar24 = lVar24 + 1;
                  local_1b8._0_8_ = uVar32;
                  local_260 = (undefined8 *)((long)puVar46 + lVar27);
                } while (uVar32 != local_1d8);
                local_260 = (undefined8 *)((long)puVar46 + lVar27);
                uVar32 = local_1d8;
              }
              local_230 = local_230 + lVar41;
              local_248 = local_248 + lVar41;
              lVar22 = lVar22 + lVar41;
              lVar34 = lVar34 + lVar41;
              local_1b8._0_4_ = iVar18 + 0x10;
              iVar44 = iVar18 + 0x1f;
              lVar23 = lVar23 + lVar41;
              iVar18 = iVar18 + 0x10;
            } while (iVar44 < (int)uVar12);
            uVar50 = uVar45 & 0xfffffff0;
          }
          uVar14 = (uint)uVar50;
          if ((int)(uVar14 | 7) < (int)uVar12) {
            lVar24 = 0;
            lVar23 = local_230;
            do {
              if (0 < (int)uVar47) {
                local_1b8._0_8_ = lVar23;
                uVar32 = 0;
                lVar26 = lVar24;
                do {
                  puVar46 = local_260;
                  lVar28 = 0;
                  lVar27 = lVar26;
                  do {
                    *(undefined1 *)((long)puVar46 + lVar28) = *(undefined1 *)(local_230 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 1) =
                         *(undefined1 *)(local_230 + local_c8 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 2) =
                         *(undefined1 *)(local_248 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 3) =
                         *(undefined1 *)(local_248 + local_c8 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 4) = *(undefined1 *)(lVar22 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 5) =
                         *(undefined1 *)(lVar22 + local_c8 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 6) = *(undefined1 *)(lVar34 + lVar27);
                    *(undefined1 *)((long)puVar46 + lVar28 + 7) =
                         *(undefined1 *)(lVar34 + local_c8 + lVar27);
                    lVar28 = lVar28 + 8;
                    lVar27 = lVar27 + (int)(uVar47 * 2);
                  } while ((int)lVar28 != 0x20);
                  uVar32 = uVar32 + 1;
                  lVar26 = lVar26 + 1;
                  local_260 = (undefined8 *)(lVar28 + (long)puVar46);
                } while (uVar32 != local_1d8);
                local_260 = (undefined8 *)((long)puVar46 + lVar28);
                uVar32 = local_1d8;
              }
              lVar23 = lVar23 + local_1e0;
              iVar18 = (int)uVar50;
              uVar14 = iVar18 + 8;
              lVar24 = lVar24 + local_1e0;
              uVar50 = (ulong)uVar14;
            } while (iVar18 + 0xf < (int)uVar12);
          }
          uVar19 = uVar14 | 1;
          while ((int)uVar19 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar71 = vpcmpeqd_avx2(auVar74._0_32_,auVar74._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar74 = ZEXT3264((undefined1  [32])0x0);
                auVar52 = vpmovdb_avx512vl(auVar71);
                *local_260 = auVar52._0_8_;
                local_260 = local_260 + 1;
                uVar50 = uVar50 + 1;
              } while (uVar32 != uVar50);
            }
            uVar19 = uVar14 + 3;
            uVar14 = uVar14 + 2;
          }
          if ((int)uVar14 < (int)uVar12) {
            do {
              uVar50 = uVar32;
              if (0 < (int)uVar47) {
                do {
                  auVar52 = vpcmpeqd_avx(auVar74._0_16_,auVar74._0_16_);
                  auVar52 = vpgatherdd((undefined1  [16])0x0,auVar52);
                  auVar74 = ZEXT1664((undefined1  [16])0x0);
                  auVar52 = vpmovdb_avx512vl(auVar52);
                  *(int *)local_260 = auVar52._0_4_;
                  local_260 = (undefined8 *)((long)local_260 + 4);
                  uVar50 = uVar50 - 1;
                } while (uVar50 != 0);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar12);
          }
          uVar14 = (uint)(local_1f0 + 7);
          iVar17 = iVar17 + iVar13;
          iVar29 = iVar29 + iVar13;
          iVar48 = iVar48 + iVar13;
          uVar15 = uVar15 + iVar13;
          uVar50 = local_1f0 + 4;
        } while ((long)(local_1f0 + 7) < (long)uVar21);
        uVar50 = local_1f0 + 4 & 0xffffffff;
      }
      uVar14 = (uint)uVar50 | 1;
      if ((int)uVar14 < (int)uVar30) {
        uVar15 = uVar12 * uVar47;
        auVar74 = vpmovsxbd_avx512f(_DAT_005a90e0);
        vpmulld_avx512f(auVar76,auVar74);
        auVar72 = vpmulld_avx512vl(auVar76._0_32_,auVar74._0_32_);
        auVar73 = vpbroadcastd_avx512vl();
        auVar71 = vpaddd_avx2(auVar73,auVar72);
        vinserti64x4_avx512f(ZEXT3264(auVar72),auVar71,1);
        lVar41 = (long)(int)(uVar47 * 8);
        auVar52 = vunpcklps_avx512vl(local_1c8,ZEXT416(uVar15 + uVar47));
        auVar75 = ZEXT1664(auVar52);
        auVar59._0_4_ = auVar73._0_4_;
        auVar59._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
        auVar52 = vshufps_avx(auVar59,auVar52,0x41);
        auVar74 = ZEXT1664(auVar52);
        uVar45 = (long)(int)(uint)uVar50;
        do {
          uVar16 = (uint)uVar45;
          pvVar39 = (this->super_Convolution).weight_data.data;
          lVar34 = (long)(int)(uVar15 * uVar16) + (long)pvVar39;
          lVar22 = (long)(int)(uVar14 * uVar15) + (long)pvVar39;
          pauVar42 = (undefined1 (*) [16])
                     ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                      (ulong)(((uint)(uVar45 >> 2) & 1) +
                              ((uint)(uVar45 >> 4) & 0xfffffff) + (uint)((uVar16 >> 3 & 1) != 0) +
                             (uint)((uVar16 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          uVar16 = 0;
          uVar14 = 0;
          if (0xf < (int)uVar12) {
            do {
              if (0 < (int)uVar47) {
                uVar50 = 0;
                do {
                  auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar34 + uVar50 + lVar41));
                  auVar94 = vpgatherdd_avx512f(*(undefined4 *)(lVar22 + uVar50 + lVar41));
                  auVar52 = vpmovdb_avx512f(auVar75);
                  *pauVar42 = auVar52;
                  auVar52 = vpmovdb_avx512f(auVar94);
                  pauVar42[1] = auVar52;
                  pauVar42 = pauVar42 + 2;
                  uVar50 = uVar50 + 1;
                } while (uVar32 != uVar50);
              }
              lVar34 = lVar34 + (int)(uVar47 << 4);
              lVar22 = lVar22 + (int)(uVar47 << 4);
              iVar13 = uVar16 + 0x1f;
              uVar16 = uVar16 + 0x10;
              uVar14 = uVar12 & 0xfffffff0;
            } while (iVar13 < (int)uVar12);
          }
          uVar16 = uVar14 | 7;
          while ((int)uVar16 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar75 = vpgatherdd_avx512f(*(undefined4 *)(lVar34 + uVar50 + (ulong)uVar15));
                auVar52 = vpmovdb_avx512f(auVar75);
                *pauVar42 = auVar52;
                pauVar42 = pauVar42 + 1;
                uVar50 = uVar50 + 1;
              } while (uVar32 != uVar50);
            }
            lVar34 = lVar34 + lVar41;
            lVar22 = lVar22 + lVar41;
            uVar16 = uVar14 + 0xf;
            uVar14 = uVar14 + 8;
          }
          uVar16 = uVar14 | 1;
          while ((int)uVar16 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar52 = vpcmpeqd_avx(auVar75._0_16_,auVar75._0_16_);
                auVar52 = vpgatherdd((undefined1  [16])0x0,auVar52);
                auVar75 = ZEXT1664((undefined1  [16])0x0);
                auVar52 = vpmovdb_avx512vl(auVar52);
                *(int *)*pauVar42 = auVar52._0_4_;
                pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + 4);
                uVar50 = uVar50 + 1;
              } while (uVar32 != uVar50);
            }
            lVar34 = lVar34 + (int)(uVar47 * 2);
            lVar22 = lVar22 + (int)(uVar47 * 2);
            uVar16 = uVar14 + 3;
            uVar14 = uVar14 + 2;
          }
          if ((int)uVar14 < (int)uVar12) {
            do {
              if (0 < (int)uVar47) {
                uVar50 = 0;
                do {
                  (*pauVar42)[0] = *(undefined1 *)(lVar34 + uVar50);
                  *(undefined1 *)((long)*pauVar42 + 1) = *(undefined1 *)(lVar22 + uVar50);
                  pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + 2);
                  uVar50 = uVar50 + 1;
                } while (uVar32 != uVar50);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar12);
          }
          uVar50 = uVar45 + 2;
          lVar34 = uVar45 + 3;
          uVar14 = (uint)lVar34;
          uVar45 = uVar50;
        } while (lVar34 < (long)uVar21);
      }
      if ((int)uVar50 < (int)uVar30) {
        auVar75 = vpmovsxbd_avx512f(_DAT_005a90e0);
        vpmulld_avx512f(auVar76,auVar75);
        vpmulld_avx512vl(auVar76._0_32_,auVar75._0_32_);
        uVar45 = (ulong)(int)uVar50;
        do {
          uVar30 = (uint)uVar45;
          lVar41 = (long)(int)(uVar12 * uVar47 * uVar30) +
                   (long)(this->super_Convolution).weight_data.data;
          pauVar42 = (undefined1 (*) [16])
                     ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                      (ulong)((uVar30 & 1) + ((uint)(uVar45 >> 4) & 0xfffffff) +
                              (uint)((uVar30 >> 3 & 1) != 0) + ((uint)(uVar45 >> 2) & 1) +
                             (uint)((uVar30 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          uVar14 = 0;
          uVar30 = 0;
          if (0xf < (int)uVar12) {
            do {
              if (0 < (int)uVar47) {
                uVar50 = 0;
                do {
                  auVar74 = vpgatherdd_avx512f(*(undefined4 *)
                                                (lVar41 + uVar50 + (ulong)(uVar12 * uVar47)));
                  auVar52 = vpmovdb_avx512f(auVar74);
                  *pauVar42 = auVar52;
                  pauVar42 = pauVar42 + 1;
                  uVar50 = uVar50 + 1;
                } while (uVar32 != uVar50);
              }
              lVar41 = lVar41 + (int)(uVar47 << 4);
              iVar13 = uVar14 + 0x1f;
              uVar14 = uVar14 + 0x10;
              uVar30 = uVar12 & 0xfffffff0;
            } while (iVar13 < (int)uVar12);
          }
          uVar14 = uVar30 | 7;
          while ((int)uVar14 < (int)uVar12) {
            if (0 < (int)uVar47) {
              uVar50 = 0;
              do {
                auVar71 = vpcmpeqd_avx2(auVar74._0_32_,auVar74._0_32_);
                auVar71 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar71);
                auVar74 = ZEXT3264((undefined1  [32])0x0);
                auVar52 = vpmovdb_avx512vl(auVar71);
                *(long *)*pauVar42 = auVar52._0_8_;
                pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + 8);
                uVar50 = uVar50 + 1;
              } while (uVar32 != uVar50);
            }
            lVar41 = lVar41 + (int)(uVar47 * 8);
            uVar14 = uVar30 + 0xf;
            uVar30 = uVar30 + 8;
          }
          if ((int)(uVar30 | 1) < (int)uVar12) {
            lVar34 = lVar41 + local_c8;
            uVar14 = uVar30;
            do {
              if (0 < (int)uVar47) {
                uVar50 = 0;
                do {
                  (*pauVar42)[0] = *(undefined1 *)(lVar41 + uVar50);
                  *(undefined1 *)((long)*pauVar42 + 1) = *(undefined1 *)(lVar34 + uVar50);
                  pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + 2);
                  uVar50 = uVar50 + 1;
                } while (uVar32 != uVar50);
              }
              lVar41 = lVar41 + (int)(uVar47 * 2);
              uVar30 = uVar14 + 2;
              iVar13 = uVar14 + 3;
              lVar34 = lVar34 + (int)(uVar47 * 2);
              uVar14 = uVar30;
            } while (iVar13 < (int)uVar12);
          }
          if ((int)uVar30 < (int)uVar12) {
            do {
              if (0 < (int)uVar47) {
                uVar50 = 0;
                do {
                  *(undefined1 *)((long)*pauVar42 + uVar50) = *(undefined1 *)(lVar41 + uVar50);
                  uVar50 = uVar50 + 1;
                } while (uVar32 != uVar50);
                pauVar42 = (undefined1 (*) [16])((long)*pauVar42 + uVar50);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar12);
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar21);
      }
      goto LAB_001816df;
    }
    iVar29 = uVar12 * uVar47;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar30,0,iVar29,(int *)&local_204,&local_11c,(int *)&local_1cc,opt->num_threads);
    iVar13 = (int)(local_204 + uVar30 + -1) / (int)local_204;
    uVar14 = 8;
    if (opt->use_packing_layout == false) {
      uVar14 = 1;
    }
    if ((uVar45 & 7) != 0) {
      uVar14 = 1;
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if (uVar47 == 1) {
      Mat::reshape(&local_198,local_138,iVar29,uVar30,(Allocator *)0x0);
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + 1;
        UNLOCK();
      }
      piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.data = local_198.data;
      local_118.refcount._0_4_ = SUB84(local_198.refcount,0);
      local_118.refcount._4_4_ = (undefined4)((ulong)local_198.refcount >> 0x20);
      local_118.elemsize = local_198.elemsize;
      local_118.elempack = local_198.elempack;
      local_118.allocator = local_198.allocator;
      local_118.d = local_198.d;
      local_118.h = local_198.h;
      local_118.dims = local_198.dims;
      local_118.w = local_198.w;
      local_118.c = local_198.c;
      local_118.cstep = local_198.cstep;
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
LAB_00180291:
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&local_198,local_138,uVar47,uVar12,uVar30,(Allocator *)0x0);
      Mat::create(&local_118,iVar29,uVar30,1,1,(Allocator *)0x0);
      if (0 < (int)uVar30) {
        uVar32 = 0;
        do {
          if ((int)uVar14 <= (int)uVar12) {
            pvVar39 = (void *)((long)local_118.w * uVar32 * local_118.elemsize +
                              (long)local_118.data);
            lVar41 = 0;
            do {
              if (0 < (int)uVar47) {
                uVar45 = 0;
                do {
                  pvVar40 = pvVar39;
                  uVar21 = 0;
                  do {
                    *(undefined1 *)((long)pvVar40 + uVar21) =
                         *(undefined1 *)
                          ((long)local_198.data +
                          uVar45 + (lVar41 + uVar21) * (long)local_198.w * local_198.elemsize +
                                   local_198.cstep * uVar32 * local_198.elemsize);
                    uVar21 = uVar21 + 1;
                  } while (uVar14 != uVar21);
                  uVar45 = uVar45 + 1;
                  pvVar39 = (void *)((long)pvVar40 + uVar21);
                } while (uVar45 != uVar47);
                pvVar39 = (void *)((long)pvVar40 + uVar21);
              }
              lVar41 = lVar41 + (ulong)uVar14;
            } while (lVar41 < (long)((long)(int)uVar12 - (ulong)(uVar14 - 1)));
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar30);
      }
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) goto LAB_00180291;
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar12 = local_1cc;
    if ((int)local_1cc < 4) {
LAB_00180356:
      Mat::create(&this->weight_sgemm_data,local_204 * uVar12,
                  (int)(uVar12 + iVar29 + -1) / (int)uVar12,
                  (int)((uVar30 - 1) + local_204) / (int)local_204,1,1,(Allocator *)0x0);
    }
    else {
      iVar17 = cpu_support_x86_avx512_vnni();
      bVar11 = true;
      if (iVar17 == 0) {
        iVar17 = cpu_support_x86_avx_vnni();
        bVar11 = iVar17 != 0;
      }
      iVar17 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar11 & iVar17 == 0)) goto LAB_00180356;
      iVar17 = 0x40;
      if ((((int)local_204 < 0x10) && (iVar17 = 0x20, (int)local_204 < 8)) &&
         (iVar17 = 0x10, (int)local_204 < 4)) {
        iVar17 = (uint)(1 < (int)local_204) * 4 + 4;
      }
      Mat::create(&this->weight_sgemm_data,(iVar17 + uVar12) * local_204,
                  (int)(uVar12 + iVar29 + -1) / (int)uVar12,
                  (int)((uVar30 - 1) + local_204) / (int)local_204,1,1,(Allocator *)0x0);
    }
    if (0 < iVar13) {
      iVar17 = 0;
      do {
        local_1b8._0_4_ = iVar17;
        iVar17 = local_204 * iVar17;
        uVar47 = uVar30 - iVar17;
        if ((int)local_204 < (int)(uVar30 - iVar17)) {
          uVar47 = local_204;
        }
        if (0 < iVar29) {
          iVar48 = 0;
          do {
            uVar14 = iVar29 - iVar48;
            if ((int)uVar12 < iVar29 - iVar48) {
              uVar14 = uVar12;
            }
            local_198.w = (this->weight_sgemm_data).w;
            local_198.cstep = (size_t)local_198.w;
            local_198.elemsize = (this->weight_sgemm_data).elemsize;
            local_198.elempack = (this->weight_sgemm_data).elempack;
            local_198.allocator = (this->weight_sgemm_data).allocator;
            local_198.data =
                 (void *)((long)(this->weight_sgemm_data).data +
                         local_198.elemsize * local_198.cstep * (long)(iVar48 / (int)uVar12) +
                         (long)(iVar17 / (int)local_204) * (this->weight_sgemm_data).cstep *
                         local_198.elemsize);
            local_198.refcount = (int *)0x0;
            local_198.dims = 2;
            local_198.h = 1;
            local_198.d = 1;
            local_198.c = 1;
            Gemm_x86_avx512_utility::pack_A_tile_int8
                      (&local_118,&local_198,iVar17,uVar47,iVar48,uVar14);
            if (local_198.refcount != (int *)0x0) {
              LOCK();
              *local_198.refcount = *local_198.refcount + -1;
              UNLOCK();
              if (*local_198.refcount == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar48 = iVar48 + local_1cc;
            uVar12 = local_1cc;
          } while (iVar48 < iVar29);
        }
        iVar17 = local_1b8._0_4_ + 1;
      } while (iVar17 != iVar13);
    }
    piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar9 == (int *)0x0) goto LAB_001816df;
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 != 0) goto LAB_001816df;
    if (local_118.allocator != (Allocator *)0x0) {
      (*(local_118.allocator)->_vptr_Allocator[3])();
      goto LAB_001816df;
    }
  }
  if (local_118.data != (void *)0x0) {
    free(local_118.data);
  }
LAB_001816df:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar41 = (long)(this->super_Convolution).num_output;
  if (0 < lVar41) {
    pvVar39 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar8 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar40 = (this->scale_in_data).data;
    lVar34 = 0;
    do {
      fVar1 = *(float *)((long)pvVar39 + lVar34 * 4);
      fVar91 = 0.0;
      if (fVar1 != 0.0) {
        fVar91 = 1.0 / (fVar1 * *pfVar8);
      }
      *(float *)((long)pvVar40 + lVar34 * 4) = fVar91;
      lVar34 = lVar34 + 1;
    } while (lVar41 != lVar34);
  }
  if (local_d0->lightmode != false) {
    piVar9 = (this->super_Convolution).weight_data.refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        pvVar39 = (this->super_Convolution).weight_data.data;
        pAVar10 = (this->super_Convolution).weight_data.allocator;
        if (pAVar10 == (Allocator *)0x0) {
          if (pvVar39 != (void *)0x0) {
            free(pvVar39);
          }
        }
        else {
          (*pAVar10->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&local_138->refcount + 4) = (undefined1  [16])0x0;
    local_138->data = (void *)0x0;
    local_138->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}